

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::ScientificMatcher::match
          (ScientificMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int32_t delta;
  int32_t iVar4;
  int32_t iVar5;
  UnicodeSet *pUVar6;
  int iVar7;
  int8_t exponentSign;
  
  bVar2 = ParsedNumber::seenNumber(result);
  if ((!bVar2) || ((result->flags & 8) != 0)) {
    return false;
  }
  delta = StringSegment::getCommonPrefixLength(segment,&this->fExponentSeparatorString);
  sVar1 = (this->fExponentSeparatorString).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (this->fExponentSeparatorString).fUnion.fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  iVar4 = StringSegment::length(segment);
  if (delta != iVar5) {
    return delta == iVar4;
  }
  bVar2 = true;
  if (iVar4 == delta) {
    return true;
  }
  StringSegment::adjustOffset(segment,delta);
  pUVar6 = anon_unknown.dwarf_1b0c3e::minusSignSet();
  bVar3 = StringSegment::startsWith(segment,pUVar6);
  if (bVar3) {
    StringSegment::adjustOffsetByCodePoint(segment);
LAB_00269df8:
    exponentSign = -1;
  }
  else {
    pUVar6 = anon_unknown.dwarf_1b0c3e::plusSignSet();
    bVar3 = StringSegment::startsWith(segment,pUVar6);
    if (bVar3) {
      StringSegment::adjustOffsetByCodePoint(segment);
      exponentSign = '\x01';
    }
    else {
      bVar3 = StringSegment::startsWith(segment,&this->fCustomMinusSign);
      if (bVar3) {
        iVar5 = StringSegment::getCommonPrefixLength(segment,&this->fCustomMinusSign);
        sVar1 = (this->fCustomMinusSign).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar7 = (this->fCustomMinusSign).fUnion.fFields.fLength;
        }
        else {
          iVar7 = (int)sVar1 >> 5;
        }
        if (iVar5 != iVar7) goto LAB_00269e6f;
        StringSegment::adjustOffset(segment,iVar5);
        goto LAB_00269df8;
      }
      bVar2 = StringSegment::startsWith(segment,&this->fCustomPlusSign);
      exponentSign = '\x01';
      if (bVar2) {
        iVar5 = StringSegment::getCommonPrefixLength(segment,&this->fCustomPlusSign);
        sVar1 = (this->fCustomPlusSign).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar7 = (this->fCustomPlusSign).fUnion.fFields.fLength;
        }
        else {
          iVar7 = (int)sVar1 >> 5;
        }
        if (iVar5 != iVar7) {
          StringSegment::adjustOffset(segment,-delta);
          return true;
        }
        StringSegment::adjustOffset(segment,iVar5);
      }
    }
  }
  bVar3 = (result->quantity).bogus;
  (result->quantity).bogus = false;
  iVar5 = StringSegment::getOffset(segment);
  bVar2 = DecimalMatcher::match(&this->fExponentMatcher,segment,result,exponentSign,status);
  (result->quantity).bogus = bVar3;
  iVar4 = StringSegment::getOffset(segment);
  if (iVar4 != iVar5) {
    *(byte *)&result->flags = (byte)result->flags | 8;
    return bVar2;
  }
LAB_00269e6f:
  StringSegment::adjustOffset(segment,-delta);
  return bVar2;
}

Assistant:

bool ScientificMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    // Only accept scientific notation after the mantissa.
    if (!result.seenNumber()) {
        return false;
    }

    // Only accept one exponent per string.
    if (0 != (result.flags & FLAG_HAS_EXPONENT)) {
        return false;
    }

    // First match the scientific separator, and then match another number after it.
    // NOTE: This is guarded by the smoke test; no need to check fExponentSeparatorString length again.
    int overlap1 = segment.getCommonPrefixLength(fExponentSeparatorString);
    if (overlap1 == fExponentSeparatorString.length()) {
        // Full exponent separator match.

        // First attempt to get a code point, returning true if we can't get one.
        if (segment.length() == overlap1) {
            return true;
        }
        segment.adjustOffset(overlap1);

        // Allow a sign, and then try to match digits.
        int8_t exponentSign = 1;
        if (segment.startsWith(minusSignSet())) {
            exponentSign = -1;
            segment.adjustOffsetByCodePoint();
        } else if (segment.startsWith(plusSignSet())) {
            segment.adjustOffsetByCodePoint();
        } else if (segment.startsWith(fCustomMinusSign)) {
            // Note: call site is guarded with startsWith, which returns false on empty string
            int32_t overlap2 = segment.getCommonPrefixLength(fCustomMinusSign);
            if (overlap2 != fCustomMinusSign.length()) {
                // Partial custom sign match; un-match the exponent separator.
                segment.adjustOffset(-overlap1);
                return true;
            }
            exponentSign = -1;
            segment.adjustOffset(overlap2);
        } else if (segment.startsWith(fCustomPlusSign)) {
            // Note: call site is guarded with startsWith, which returns false on empty string
            int32_t overlap2 = segment.getCommonPrefixLength(fCustomPlusSign);
            if (overlap2 != fCustomPlusSign.length()) {
                // Partial custom sign match; un-match the exponent separator.
                segment.adjustOffset(-overlap1);
                return true;
            }
            segment.adjustOffset(overlap2);
        }

        // We are supposed to accept E0 after NaN, so we need to make sure result.quantity is available.
        bool wasBogus = result.quantity.bogus;
        result.quantity.bogus = false;
        int digitsOffset = segment.getOffset();
        bool digitsReturnValue = fExponentMatcher.match(segment, result, exponentSign, status);
        result.quantity.bogus = wasBogus;

        if (segment.getOffset() != digitsOffset) {
            // At least one exponent digit was matched.
            result.flags |= FLAG_HAS_EXPONENT;
        } else {
            // No exponent digits were matched; un-match the exponent separator.
            segment.adjustOffset(-overlap1);
        }
        return digitsReturnValue;

    } else if (overlap1 == segment.length()) {
        // Partial exponent separator match
        return true;
    }

    // No match
    return false;
}